

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeItemParserInfo(cmComputeLinkInformation *this)

{
  cmMakefile *this_00;
  size_type sVar1;
  string *psVar2;
  cmValue cVar3;
  _Base_ptr p_Var4;
  string *i_1;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *i;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  string libext;
  string reg;
  string reg_static;
  string local_68;
  string reg_any;
  
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_STATIC_LIBRARY_PREFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkPrefix(this,psVar2);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_SHARED_LIBRARY_PREFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkPrefix(this,psVar2);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkExtension(this,psVar2,LinkShared);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_STATIC_LIBRARY_SUFFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkExtension(this,psVar2,LinkStatic);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_SHARED_LIBRARY_SUFFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkExtension(this,psVar2,LinkShared);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_LINK_LIBRARY_SUFFIX",(allocator<char> *)&reg);
  psVar2 = cmMakefile::GetSafeDefinition(this_00,&libext);
  AddLinkExtension(this,psVar2,LinkUnknown);
  std::__cxx11::string::~string((string *)&libext);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_EXTRA_LINK_EXTENSIONS",(allocator<char> *)&reg);
  cVar3 = cmMakefile::GetDefinition(this_00,&libext);
  std::__cxx11::string::~string((string *)&libext);
  if (cVar3.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&libext,(string *)cVar3.Value);
    init._M_len = 1;
    init._M_array = &libext;
    cmList::cmList((cmList *)&reg,init);
    std::__cxx11::string::~string((string *)&libext);
    sVar1 = reg._M_string_length;
    for (_Var5 = reg._M_dataplus; _Var5._M_p != (pointer)sVar1; _Var5._M_p = _Var5._M_p + 0x20) {
      AddLinkExtension(this,(string *)_Var5._M_p,LinkUnknown);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reg);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&libext,"CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES",(allocator<char> *)&reg);
  cVar3 = cmMakefile::GetDefinition(this_00,&libext);
  std::__cxx11::string::~string((string *)&libext);
  if (cVar3.Value != (string *)0x0) {
    std::__cxx11::string::string((string *)&libext,(string *)cVar3.Value);
    init_00._M_len = 1;
    init_00._M_array = &libext;
    cmList::cmList((cmList *)&reg,init_00);
    std::__cxx11::string::~string((string *)&libext);
    for (_Var5 = reg._M_dataplus; _Var5._M_p != (pointer)reg._M_string_length;
        _Var5._M_p = _Var5._M_p + 0x20) {
      AddLinkExtension(this,(string *)_Var5._M_p,LinkShared);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&reg);
  }
  CreateExtensionRegex(&libext,this,&this->LinkExtensions,LinkUnknown);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&reg,"(.*)",(allocator<char> *)&reg_any);
  std::__cxx11::string::append((string *)&reg);
  cmOrderDirectories::SetLinkExtensionInfo
            ((this->OrderLinkerSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,&this->LinkExtensions,
             &reg);
  std::__cxx11::string::assign((char *)&reg);
  for (p_Var4 = (this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->LinkPrefixes)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::__cxx11::string::append((string *)&reg);
    std::__cxx11::string::push_back((char)&reg);
  }
  std::__cxx11::string::append((char *)&reg);
  cmStrCat<std::__cxx11::string&,std::__cxx11::string&>(&reg_any,&reg,&libext);
  cmsys::RegularExpression::compile(&this->ExtractAnyLibraryName,reg_any._M_dataplus._M_p);
  if ((this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->StaticLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    CreateExtensionRegex(&local_68,this,&this->StaticLinkExtensions,LinkStatic);
    cmStrCat<std::__cxx11::string&,std::__cxx11::string>(&reg_static,&reg,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    cmsys::RegularExpression::compile(&this->ExtractStaticLibraryName,reg_static._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&reg_static);
  }
  if ((this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->SharedLinkExtensions).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string((string *)&reg_static,(string *)&reg);
    CreateExtensionRegex(&local_68,this,&this->SharedLinkExtensions,LinkShared);
    std::__cxx11::string::operator=((string *)&this->SharedRegexString,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::append((string *)&reg_static);
    cmsys::RegularExpression::compile(&this->ExtractSharedLibraryName,reg_static._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&reg_static);
  }
  std::__cxx11::string::~string((string *)&reg_any);
  std::__cxx11::string::~string((string *)&reg);
  std::__cxx11::string::~string((string *)&libext);
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeItemParserInfo()
{
  // Get possible library name prefixes.
  cmMakefile* mf = this->Makefile;
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_PREFIX"));
  this->AddLinkPrefix(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_PREFIX"));

  // Import library names should be matched and treated as shared
  // libraries for the purposes of linking.
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_STATIC_LIBRARY_SUFFIX"),
                         LinkStatic);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_SHARED_LIBRARY_SUFFIX"),
                         LinkShared);
  this->AddLinkExtension(mf->GetSafeDefinition("CMAKE_LINK_LIBRARY_SUFFIX"),
                         LinkUnknown);
  if (cmValue linkSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_LINK_EXTENSIONS")) {
    cmList linkSuffixList{ *linkSuffixes };
    for (auto const& i : linkSuffixList) {
      this->AddLinkExtension(i, LinkUnknown);
    }
  }
  if (cmValue sharedSuffixes =
        mf->GetDefinition("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")) {
    cmList sharedSuffixList{ *sharedSuffixes };
    for (std::string const& i : sharedSuffixList) {
      this->AddLinkExtension(i, LinkShared);
    }
  }

  // Compute a regex to match link extensions.
  std::string libext =
    this->CreateExtensionRegex(this->LinkExtensions, LinkUnknown);

  // Create regex to remove any library extension.
  std::string reg("(.*)");
  reg += libext;
  this->OrderLinkerSearchPath->SetLinkExtensionInfo(this->LinkExtensions, reg);

  // Create a regex to match a library name.  Match index 1 will be
  // the prefix if it exists and empty otherwise.  Match index 2 will
  // be the library name.  Match index 3 will be the library
  // extension.
  reg = "^(";
  for (std::string const& p : this->LinkPrefixes) {
    reg += p;
    reg += '|';
  }
  reg += ")([^/:]*)";

  // Create a regex to match any library name.
  std::string reg_any = cmStrCat(reg, libext);
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
  fprintf(stderr, "any regex [%s]\n", reg_any.c_str());
#endif
  this->ExtractAnyLibraryName.compile(reg_any);

  // Create a regex to match static library names.
  if (!this->StaticLinkExtensions.empty()) {
    std::string reg_static = cmStrCat(
      reg, this->CreateExtensionRegex(this->StaticLinkExtensions, LinkStatic));
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "static regex [%s]\n", reg_static.c_str());
#endif
    this->ExtractStaticLibraryName.compile(reg_static);
  }

  // Create a regex to match shared library names.
  if (!this->SharedLinkExtensions.empty()) {
    std::string reg_shared = reg;
    this->SharedRegexString =
      this->CreateExtensionRegex(this->SharedLinkExtensions, LinkShared);
    reg_shared += this->SharedRegexString;
#ifdef CM_COMPUTE_LINK_INFO_DEBUG
    fprintf(stderr, "shared regex [%s]\n", reg_shared.c_str());
#endif
    this->ExtractSharedLibraryName.compile(reg_shared);
  }
}